

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71> __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
          (BasicExprFactory<std::allocator<char>> *this,LogicalExpr condition,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> then_expr,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> else_expr)

{
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71> BVar1;
  
  BVar1.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>)
       Allocate<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
                 (this,IFSYM,0);
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.impl_ + 8))->
  impl_ = (Impl *)condition.super_ExprBase.impl_;
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.impl_ + 0x10))
  ->impl_ = (Impl *)then_expr.super_ExprBase.impl_;
  ((ExprBase *)
  ((long)BVar1.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.impl_ + 0x18))
  ->impl_ = (Impl *)else_expr.super_ExprBase.impl_;
  return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>)
         BVar1.super_BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeIf(LogicalExpr condition, Arg then_expr, Arg else_expr) {
    /// else_expr can be null.
    MP_ASSERT(condition != 0 && then_expr != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(ExprType::KIND);
    impl->condition = condition.impl_;
    impl->then_expr = then_expr.impl_;
    impl->else_expr = else_expr.impl_;
    return Expr::Create<ExprType>(impl);
  }